

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::hufDecode(longlong *hcode,HufDec *hdecod,char *in,int ni,int rlc,int no,
                       unsigned_short *out)

{
  ulong uVar1;
  unsigned_short *ob;
  bool bVar2;
  int iVar3;
  uint uVar4;
  unsigned_short *oe_00;
  byte *in_end;
  ulong *puVar5;
  longlong lVar6;
  ulong uVar7;
  int in_ECX;
  byte *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  unsigned_short *in_stack_00000008;
  HufDec pl_1;
  int i;
  int l;
  uint j;
  HufDec pl;
  char *ie;
  unsigned_short *oe;
  unsigned_short *outb;
  int lc;
  longlong c;
  uint local_88;
  uint local_6c;
  uint local_68;
  int local_3c;
  ulong local_38;
  int local_2c;
  int local_28;
  int local_24;
  byte *local_20;
  long local_18;
  long local_10;
  
  ob = in_stack_00000008;
  local_38 = 0;
  local_3c = 0;
  oe_00 = in_stack_00000008 + in_R9D;
  in_end = in_RDX + (in_ECX + 7) / 8;
  local_2c = in_R9D;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if (in_end <= local_20) {
      uVar4 = 8U - local_24 & 7;
      local_38 = (long)local_38 >> (sbyte)uVar4;
      local_3c = local_3c - uVar4;
      while( true ) {
        if (local_3c < 1) {
          if ((long)in_stack_00000008 - (long)ob >> 1 != (long)local_2c) {
            return false;
          }
          return true;
        }
        uVar7 = *(ulong *)(local_18 + (local_38 << (0xeU - (char)local_3c & 0x3f) & 0x3fff) * 0x10);
        local_88 = (uint)uVar7;
        if ((uVar7 & 0xff) == 0) break;
        local_3c = local_3c - (local_88 & 0xff);
        bVar2 = getCode(local_88 >> 8,local_28,(longlong *)&local_38,&local_3c,(char **)&local_20,
                        (char *)in_end,&stack0x00000008,ob,oe_00);
        if (!bVar2) {
          return false;
        }
      }
      return false;
    }
    local_38 = local_38 << 8 | (ulong)*local_20;
    local_3c = local_3c + 8;
    local_20 = local_20 + 1;
    while (0xd < local_3c) {
      puVar5 = (ulong *)(local_18 +
                        ((long)local_38 >> ((char)local_3c - 0xeU & 0x3f) & 0x3fffU) * 0x10);
      uVar7 = *puVar5;
      uVar1 = puVar5[1];
      local_68 = (uint)uVar7;
      if ((uVar7 & 0xff) == 0) {
        if (uVar1 == 0) {
          return false;
        }
        for (local_6c = 0; local_6c < local_68 >> 8; local_6c = local_6c + 1) {
          lVar6 = hufLength(*(longlong *)
                             (local_10 + (ulong)*(uint *)(uVar1 + (ulong)local_6c * 4) * 8));
          iVar3 = (int)lVar6;
          for (; local_3c < iVar3 && local_20 < in_end; local_3c = local_3c + 8) {
            local_38 = local_38 << 8 | (ulong)*local_20;
            local_20 = local_20 + 1;
          }
          if ((iVar3 <= local_3c) &&
             (uVar7 = hufCode(*(longlong *)
                               (local_10 + (ulong)*(uint *)(uVar1 + (ulong)local_6c * 4) * 8)),
             uVar7 == ((long)local_38 >> ((char)local_3c - (byte)lVar6 & 0x3f) &
                      (1L << ((byte)lVar6 & 0x3f)) - 1U))) {
            local_3c = local_3c - iVar3;
            bVar2 = getCode(*(int *)(uVar1 + (ulong)local_6c * 4),local_28,(longlong *)&local_38,
                            &local_3c,(char **)&local_20,(char *)in_end,&stack0x00000008,ob,oe_00);
            if (!bVar2) {
              return false;
            }
            break;
          }
        }
        if (local_6c == local_68 >> 8) {
          return false;
        }
      }
      else {
        local_3c = local_3c - (local_68 & 0xff);
        bVar2 = getCode(local_68 >> 8,local_28,(longlong *)&local_38,&local_3c,(char **)&local_20,
                        (char *)in_end,&stack0x00000008,ob,oe_00);
        if (!bVar2) {
          return false;
        }
      }
    }
  } while( true );
}

Assistant:

static bool hufDecode(const long long *hcode,  // i : encoding table
                      const HufDec *hdecod,    // i : decoding table
                      const char *in,          // i : compressed input buffer
                      int ni,                  // i : input size (in bits)
                      int rlc,                 // i : run-length code
                      int no,  // i : expected output size (in bytes)
                      unsigned short *out)  //  o: uncompressed output buffer
{
  long long c = 0;
  int lc = 0;
  unsigned short *outb = out;          // begin
  unsigned short *oe = out + no;       // end
  const char *ie = in + (ni + 7) / 8;  // input byte size

  //
  // Loop on input bytes
  //

  while (in < ie) {
    getChar(c, lc, in);

    //
    // Access decoding table
    //

    while (lc >= HUF_DECBITS) {
      const HufDec pl = hdecod[(c >> (lc - HUF_DECBITS)) & HUF_DECMASK];

      if (pl.len) {
        //
        // Get short code
        //

        lc -= pl.len;
        // std::cout << "lit = " << pl.lit << std::endl;
        // std::cout << "rlc = " << rlc << std::endl;
        // std::cout << "c = " << c << std::endl;
        // std::cout << "lc = " << lc << std::endl;
        // std::cout << "in = " << in << std::endl;
        // std::cout << "out = " << out << std::endl;
        // std::cout << "oe = " << oe << std::endl;
        if (!getCode(pl.lit, rlc, c, lc, in, ie, out, outb, oe)) {
          return false;
        }
      } else {
        if (!pl.p) {
          return false;
        }
        // invalidCode(); // wrong code

        //
        // Search long code
        //

        unsigned int j;

        for (j = 0; j < pl.lit; j++) {
          int l = hufLength(hcode[pl.p[j]]);

          while (lc < l && in < ie)  // get more bits
            getChar(c, lc, in);

          if (lc >= l) {
            if (hufCode(hcode[pl.p[j]]) ==
                ((c >> (lc - l)) & (((long long)(1) << l) - 1))) {
              //
              // Found : get long code
              //

              lc -= l;
              if (!getCode(pl.p[j], rlc, c, lc, in, ie, out, outb, oe)) {
                return false;
              }
              break;
            }
          }
        }

        if (j == pl.lit) {
          return false;
          // invalidCode(); // Not found
        }
      }
    }
  }

  //
  // Get remaining (short) codes
  //

  int i = (8 - ni) & 7;
  c >>= i;
  lc -= i;

  while (lc > 0) {
    const HufDec pl = hdecod[(c << (HUF_DECBITS - lc)) & HUF_DECMASK];

    if (pl.len) {
      lc -= pl.len;
      if (!getCode(pl.lit, rlc, c, lc, in, ie, out, outb, oe)) {
        return false;
      }
    } else {
      return false;
      // invalidCode(); // wrong (long) code
    }
  }

  if (out - outb != no) {
    return false;
  }
  // notEnoughData ();

  return true;
}